

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction(float v0,float *ptr,int size0,int stride0,int size1,int stride1,int op_type)

{
  int in_R9D;
  float in_XMM0_Da;
  int unaff_retaddr;
  int in_stack_fffffffffffffffc;
  
  if (in_R9D == 0) {
    in_XMM0_Da = reduction<ncnn::reduction_op_add>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 1) {
    in_XMM0_Da = reduction<ncnn::reduction_op_asum>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 2) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumsq>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 6) {
    in_XMM0_Da = reduction<ncnn::reduction_op_mul>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 4) {
    in_XMM0_Da = reduction<ncnn::reduction_op_max>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 5) {
    in_XMM0_Da = reduction<ncnn::reduction_op_min>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  else if (in_R9D == 10) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumexp>
                           ((float)size0,(float *)CONCAT44(size1,stride1),op_type,unaff_retaddr,
                            in_stack_fffffffffffffffc,(int)in_XMM0_Da);
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int stride0, int size1, int stride1, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size0, stride0, size1, stride1);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size0, stride0, size1, stride1);

    // should never reach here
    return v0;
}